

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

void __thiscall
wasm::TranslateToFuzzReader::fixAfterChanges(wasm::Function*)::Fixer::visitExpression(wasm::
Expression__(void *this,Expression *curr)

{
  int iVar1;
  uintptr_t uVar2;
  Id IVar3;
  const_iterator cVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  undefined8 *puVar9;
  long lVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  ulong uVar13;
  Switch *cast;
  
  IVar3 = curr->_id;
  if ((int)IVar3 < 3) {
    if (IVar3 == BlockId) goto LAB_001360b9;
    if (IVar3 == InvalidId) goto LAB_0013636a;
  }
  else if ((IVar3 == LoopId) || (IVar3 == TryId)) {
LAB_001360b9:
    if (curr[1].type.id != 0) {
      cVar4 = std::
              _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      *)((long)this + 0x158),(key_type *)(curr + 1));
      if (cVar4._M_node == (_Base_ptr)((long)this + 0x160)) {
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::_M_insert_unique<wasm::Name_const&>
                  ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                    *)((long)this + 0x158),(Name *)(curr + 1));
      }
      else {
        fixAfterChanges::Fixer::replace((Fixer *)this);
      }
    }
    IVar3 = curr->_id;
  }
  else if (IVar3 == NumExpressionIds) goto LAB_0013636a;
  lVar7 = 0x18;
  if ((int)IVar3 < 0x31) {
    if (IVar3 != BreakId) {
      if (IVar3 == SwitchId) {
        uVar2 = curr[3].type.id;
        if (uVar2 != 0) {
          lVar7 = *(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3;
          if (lVar7 + *(long *)((long)this + 0xd8) != 0) {
            uVar5 = (ulong)(((int)*(long *)((long)this + 0xd8) + (int)lVar7) - 1);
            puVar9 = (undefined8 *)(*(long *)((long)this + 0x130) + uVar5 * 8 + -0x50);
            puVar11 = (undefined8 *)((long)this + uVar5 * 8 + 0xe0);
            do {
              uVar6 = (uint)uVar5;
              puVar12 = puVar9;
              if (uVar6 < 10) {
                puVar12 = puVar11;
              }
              iVar1 = *(int *)*puVar12;
              if (iVar1 < 3) {
                if (iVar1 == 1) {
LAB_001361b6:
                  if (*(uintptr_t *)((int *)*puVar12 + 6) == uVar2) goto LAB_001361d1;
                }
                else if (iVar1 != 2) goto LAB_00136382;
              }
              else {
                if (iVar1 == 3) goto LAB_001361b6;
                if (iVar1 != 0x31) goto LAB_00136382;
              }
              puVar9 = puVar9 + -1;
              puVar11 = puVar11 + -1;
              uVar5 = (ulong)(uVar6 - 1);
            } while (uVar6 != 0);
          }
          fixAfterChanges::Fixer::replace((Fixer *)this);
        }
LAB_001361d1:
        uVar5 = curr[1].type.id;
        if (uVar5 == 0) {
          return;
        }
        uVar13 = 0;
        do {
          lVar7 = *(long *)(*(long *)(curr + 1) + 8 + uVar13 * 0x10);
          if (lVar7 != 0) {
            lVar10 = *(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3;
            if (lVar10 + *(long *)((long)this + 0xd8) != 0) {
              uVar8 = (ulong)(((int)*(long *)((long)this + 0xd8) + (int)lVar10) - 1);
              puVar11 = (undefined8 *)(*(long *)((long)this + 0x130) + uVar8 * 8 + -0x50);
              puVar9 = (undefined8 *)((long)this + uVar8 * 8 + 0xe0);
              do {
                uVar6 = (uint)uVar8;
                puVar12 = puVar11;
                if (uVar6 < 10) {
                  puVar12 = puVar9;
                }
                iVar1 = *(int *)*puVar12;
                if (iVar1 < 3) {
                  if (iVar1 == 1) {
LAB_0013626c:
                    if (*(long *)((int *)*puVar12 + 6) == lVar7) goto LAB_0013628b;
                  }
                  else if (iVar1 != 2) goto LAB_00136382;
                }
                else {
                  if (iVar1 == 3) goto LAB_0013626c;
                  if (iVar1 != 0x31) goto LAB_00136382;
                }
                puVar11 = puVar11 + -1;
                puVar9 = puVar9 + -1;
                uVar8 = (ulong)(uVar6 - 1);
              } while (uVar6 != 0);
            }
            fixAfterChanges::Fixer::replace((Fixer *)this);
            uVar5 = curr[1].type.id;
          }
LAB_0013628b:
          uVar13 = (ulong)((int)uVar13 + 1);
          if (uVar5 <= uVar13) {
            return;
          }
        } while( true );
      }
      if (IVar3 != InvalidId) {
        return;
      }
LAB_0013636a:
      wasm::handle_unreachable
                ("unexpected expression type",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                 ,0xb0);
    }
  }
  else if ((int)IVar3 < 0x3b) {
    if (IVar3 == TryId) {
      lVar7 = 0x70;
    }
    else if (IVar3 != RethrowId) {
      return;
    }
  }
  else {
    if (IVar3 != BrOnId) {
      if (IVar3 != NumExpressionIds) {
        return;
      }
      goto LAB_0013636a;
    }
    lVar7 = 0x20;
  }
  lVar7 = *(long *)((long)&curr->_id + lVar7);
  if (lVar7 == 0) {
    return;
  }
  lVar10 = *(long *)((long)this + 0x138) - *(long *)((long)this + 0x130) >> 3;
  if (lVar10 + *(long *)((long)this + 0xd8) != 0) {
    uVar5 = (ulong)(((int)*(long *)((long)this + 0xd8) + (int)lVar10) - 1);
    puVar9 = (undefined8 *)(*(long *)((long)this + 0x130) + uVar5 * 8 + -0x50);
    puVar11 = (undefined8 *)((long)this + uVar5 * 8 + 0xe0);
    do {
      uVar6 = (uint)uVar5;
      puVar12 = puVar9;
      if (uVar6 < 10) {
        puVar12 = puVar11;
      }
      iVar1 = *(int *)*puVar12;
      if (iVar1 < 3) {
        if (iVar1 == 1) {
LAB_0013632e:
          if (*(long *)((int *)*puVar12 + 6) == lVar7) {
            return;
          }
        }
        else if (iVar1 != 2) goto LAB_00136382;
      }
      else {
        if (iVar1 == 3) goto LAB_0013632e;
        if (iVar1 != 0x31) {
LAB_00136382:
          __assert_fail("curr->is<If>() || curr->is<Try>()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                        ,0x399,
                        "bool wasm::TranslateToFuzzReader::fixAfterChanges(Function *)::Fixer::hasBreakTarget(Name)"
                       );
        }
      }
      puVar9 = puVar9 + -1;
      puVar11 = puVar11 + -1;
      uVar5 = (ulong)(uVar6 - 1);
    } while (uVar6 != 0);
  }
  fixAfterChanges::Fixer::replace((Fixer *)this);
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      // Note all scope names, and fix up all uses.
      BranchUtils::operateOnScopeNameDefs(curr, [&](Name& name) {
        if (name.is()) {
          if (seen.count(name)) {
            replace();
          } else {
            seen.insert(name);
          }
        }
      });
      BranchUtils::operateOnScopeNameUses(curr, [&](Name& name) {
        if (name.is()) {
          replaceIfInvalid(name);
        }
      });
    }